

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O1

void __thiscall TApp_RequiresChainedFlags_Test::TestBody(TApp_RequiresChainedFlags_Test *this)

{
  App *this_00;
  input_t *piVar1;
  TApp *pTVar2;
  bool bVar3;
  Option *pOVar4;
  Option *pOVar5;
  long lVar6;
  AssertHelper local_160;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_148 [16];
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  TApp *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"--opt1","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  this_00 = &(this->super_TApp).app;
  pOVar4 = CLI::App::add_flag(this_00,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"--opt2","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  pOVar5 = CLI::App::add_flag(this_00,&local_90,&local_b0);
  pOVar4 = CLI::Option::requires(pOVar5,pOVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"--opt3","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
  pOVar5 = CLI::App::add_flag(this_00,&local_d0,&local_f0);
  CLI::Option::requires(pOVar5,pOVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  local_158[0].ptr_ = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"--opt1","");
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_158,
             local_138);
  if (local_158[0].ptr_ != local_148) {
    operator_delete(local_158[0].ptr_);
  }
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  local_158[0].ptr_ = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"--opt2","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_158,
             local_138);
  if (local_158[0].ptr_ != local_148) {
    operator_delete(local_158[0].ptr_);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_158);
  testing::internal::AssertHelper::AssertHelper
            (&local_160,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x46b,
             "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_160,(Message *)local_158);
  testing::internal::AssertHelper::~AssertHelper(&local_160);
  if (local_158[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) &&
       (local_158[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_158[0].ptr_ + 8))();
    }
    local_158[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  CLI::App::reset(this_00);
  local_158[0].ptr_ = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"--opt3","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_158,
             (string *)local_138);
  local_f8 = &this->super_TApp;
  if (local_158[0].ptr_ != local_148) {
    operator_delete(local_158[0].ptr_);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    TApp::run(local_f8);
  }
  testing::Message::Message((Message *)local_158);
  testing::internal::AssertHelper::AssertHelper
            (&local_160,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x46f,
             "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_160,(Message *)local_158);
  testing::internal::AssertHelper::~AssertHelper(&local_160);
  if (local_158[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) &&
       (local_158[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_158[0].ptr_ + 8))();
    }
    local_158[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  CLI::App::reset(this_00);
  local_158[0].ptr_ = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"--opt3","");
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"--opt2","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_158,
             local_118);
  pTVar2 = local_f8;
  lVar6 = 0;
  do {
    if (local_128 + lVar6 != *(undefined1 **)((long)local_138 + lVar6)) {
      operator_delete(*(undefined1 **)((long)local_138 + lVar6));
    }
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x40);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    TApp::run(pTVar2);
  }
  testing::Message::Message((Message *)local_158);
  testing::internal::AssertHelper::AssertHelper
            (&local_160,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x473,
             "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_160,(Message *)local_158);
  testing::internal::AssertHelper::~AssertHelper(&local_160);
  if (local_158[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) &&
       (local_158[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_158[0].ptr_ + 8))();
    }
    local_158[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  CLI::App::reset(this_00);
  local_158[0].ptr_ = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"--opt3","");
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"--opt1","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_158,
             local_118);
  pTVar2 = local_f8;
  lVar6 = 0;
  do {
    if (local_128 + lVar6 != *(undefined1 **)((long)local_138 + lVar6)) {
      operator_delete(*(undefined1 **)((long)local_138 + lVar6));
    }
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x40);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    TApp::run(pTVar2);
  }
  testing::Message::Message((Message *)local_158);
  testing::internal::AssertHelper::AssertHelper
            (&local_160,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x477,
             "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_160,(Message *)local_158);
  testing::internal::AssertHelper::~AssertHelper(&local_160);
  if (local_158[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) &&
       (local_158[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_158[0].ptr_ + 8))();
    }
    local_158[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  CLI::App::reset(this_00);
  local_158[0].ptr_ = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"--opt2","");
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"--opt1","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_158,
             (string *)local_118);
  pTVar2 = local_f8;
  lVar6 = 0;
  do {
    if (local_128 + lVar6 != *(undefined1 **)((long)local_138 + lVar6)) {
      operator_delete(*(undefined1 **)((long)local_138 + lVar6));
    }
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x40);
  TApp::run(pTVar2);
  CLI::App::reset(this_00);
  local_158[0].ptr_ = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"--opt1","");
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"--opt2","");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"--opt3","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_158,
             &local_f8);
  lVar6 = 0;
  do {
    if (local_108 + lVar6 != *(undefined1 **)((long)local_118 + lVar6)) {
      operator_delete(*(undefined1 **)((long)local_118 + lVar6));
    }
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x60);
  TApp::run(pTVar2);
  return;
}

Assistant:

TEST_F(TApp, RequiresChainedFlags) {
    CLI::Option *opt1 = app.add_flag("--opt1");
    CLI::Option *opt2 = app.add_flag("--opt2")->requires(opt1);
    app.add_flag("--opt3")->requires(opt2);

    run();

    app.reset();
    args = {"--opt1"};
    run();

    app.reset();
    args = {"--opt2"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--opt3"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--opt3", "--opt2"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--opt3", "--opt1"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--opt2", "--opt1"};
    run();

    app.reset();
    args = {"--opt1", "--opt2", "--opt3"};
    run();
}